

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

void VW::read_line_json<false>
               (vw *all,v_array<example_*> *examples,char *line,example_factory_t example_factory,
               void *ex_factory_context)

{
  bool bVar1;
  ParseErrorCode parseErrorCode;
  VWReaderHandler<false> *this;
  ostream *poVar2;
  size_t sVar3;
  char *pcVar4;
  vw_exception *this_00;
  stringstream *pfile;
  string *pmessage;
  undefined8 uVar5;
  Ch *in_RDX;
  EVP_PKEY_CTX *in_RDI;
  ParseResult PVar6;
  stringstream __msg;
  BaseState<false> *current_state;
  ParseResult result;
  VWReaderHandler<false> *handler;
  json_parser<false> *parser;
  InsituStringStream ss;
  char *local_2b0;
  VWReaderHandler<false> *in_stack_fffffffffffffd60;
  int plineNumber;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_stack_fffffffffffffd68;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffd70;
  string local_220 [48];
  stringstream local_1f0 [16];
  ostream local_1e0;
  BaseState<false> *local_68;
  ParseResult local_60;
  VWReaderHandler<false> *local_50;
  element_type *local_48;
  GenericInsituStringStream<rapidjson::UTF8<char>_> local_40;
  Ch *local_18;
  EVP_PKEY_CTX *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>::GenericInsituStringStream
            (&local_40,in_RDX);
  local_48 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)
                        (*(long *)(local_8 + 8) + 0x380));
  this = (VWReaderHandler<false> *)((long)local_48 + 0x40);
  local_50 = this;
  strlen(local_18);
  VWReaderHandler<false>::init(this,local_8);
  PVar6 = rapidjson::
          GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                    (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  local_60.offset_ = PVar6.offset_;
  local_60.code_ = PVar6.code_;
  bVar1 = rapidjson::ParseResult::IsError(&local_60);
  if (!bVar1) {
    return;
  }
  local_68 = VWReaderHandler<false>::current_state(local_50);
  std::__cxx11::stringstream::stringstream(local_1f0);
  poVar2 = std::operator<<(&local_1e0,"JSON parser error at ");
  sVar3 = rapidjson::ParseResult::Offset(&local_60);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2,": ");
  parseErrorCode = rapidjson::ParseResult::Code(&local_60);
  pcVar4 = rapidjson::GetParseError_En(parseErrorCode);
  poVar2 = std::operator<<(poVar2,pcVar4);
  this_00 = (vw_exception *)std::operator<<(poVar2,". Handler: ");
  pfile = VWReaderHandler<false>::error_abi_cxx11_((VWReaderHandler<false> *)0x2d8fa9);
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)this_00,local_220);
  pmessage = (string *)std::operator<<(poVar2,"State: ");
  plineNumber = (int)((ulong)poVar2 >> 0x20);
  if (local_68 == (BaseState<false> *)0x0) {
    local_2b0 = "null";
  }
  else {
    local_2b0 = local_68->name;
  }
  std::operator<<((ostream *)pmessage,local_2b0);
  std::__cxx11::string::~string(local_220);
  uVar5 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  vw_exception::vw_exception(this_00,(char *)pfile,plineNumber,pmessage);
  __cxa_throw(uVar5,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void read_line_json(
    vw& all, v_array<example*>& examples, char* line, example_factory_t example_factory, void* ex_factory_context)
{
  // string line_copy(line);
  // destructive parsing
  InsituStringStream ss(line);
  json_parser<audit>* parser = static_cast<json_parser<audit>*>(all.p->jsonp.get());

  VWReaderHandler<audit>& handler = parser->handler;
  handler.init(&all, &examples, &ss, line + strlen(line), example_factory, ex_factory_context);

  ParseResult result =
      parser->reader.template Parse<kParseInsituFlag, InsituStringStream, VWReaderHandler<audit>>(ss, handler);
  if (!result.IsError())
    return;

  BaseState<audit>* current_state = handler.current_state();

  THROW("JSON parser error at " << result.Offset() << ": " << GetParseError_En(result.Code())
                                << ". "
                                   "Handler: "
                                << handler.error().str()
                                << "State: " << (current_state ? current_state->name : "null"));  // <<
  // "Line: '"<< line_copy << "'");
}